

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void helicsBrokerFree(HelicsBroker broker)

{
  BrokerObject *pBVar1;
  BrokerObject *brokerObj;
  int in_stack_0000005c;
  MasterObjectHolder *in_stack_00000060;
  HelicsError *in_stack_ffffffffffffffd0;
  HelicsBroker in_stack_ffffffffffffffd8;
  
  pBVar1 = helics::getBrokerObject(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (pBVar1 != (BrokerObject *)0x0) {
    pBVar1->valid = 0;
    getMasterHolder();
    std::__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a1b47);
    MasterObjectHolder::clearBroker(in_stack_00000060,in_stack_0000005c);
    std::shared_ptr<MasterObjectHolder>::~shared_ptr((shared_ptr<MasterObjectHolder> *)0x1a1b63);
  }
  helics::BrokerFactory::cleanUpBrokers();
  return;
}

Assistant:

void helicsBrokerFree(HelicsBroker broker)
{
    auto* brokerObj = helics::getBrokerObject(broker, nullptr);
    if (brokerObj != nullptr) {
        brokerObj->valid = 0;
        getMasterHolder()->clearBroker(brokerObj->index);
    }
    helics::BrokerFactory::cleanUpBrokers();
}